

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprop.c
# Opt level: O2

void trn_rprop(mdl_t *mdl)

{
  opt_t *poVar1;
  char *pcVar2;
  long lVar3;
  uint32_t it;
  grd_t *pgVar4;
  double dVar5;
  mdl_t *pmVar6;
  _Bool _Var7;
  uint32_t w;
  int iVar8;
  double *x;
  double *pdVar9;
  double *x_00;
  FILE *pFVar10;
  undefined8 *__ptr;
  uint64_t f;
  double dVar11;
  uint64_t f_2;
  double dVar12;
  uint64_t i;
  ulong uVar13;
  bool bVar14;
  ulong uStack_b0;
  void *pvStack_a8;
  ulong local_a0;
  uint64_t nftr;
  uint64_t f_1;
  double vxp;
  double vstp;
  double vgp;
  grd_t *local_70;
  double *local_68;
  int local_60;
  uint32_t local_5c;
  int type;
  double local_50;
  double local_48;
  mdl_t *local_40;
  byte local_31;
  
  poVar1 = mdl->opt;
  dVar12 = (double)mdl->nftr;
  local_5c = poVar1->maxiter;
  local_48 = (double)(ulong)poVar1->nthread;
  uStack_b0 = 0x10cc31;
  local_40 = mdl;
  iVar8 = strcmp(poVar1->algo,"rprop-");
  bVar14 = iVar8 == 0;
  _Var7 = (poVar1->rprop).cutoff;
  uStack_b0 = 0x10cc48;
  x = xvm_new((uint64_t)dVar12);
  uStack_b0 = 0x10cc53;
  pdVar9 = xvm_new((uint64_t)dVar12);
  uStack_b0 = 0x10cc5e;
  x_00 = xvm_new((uint64_t)dVar12);
  if ((_Var7 & 1U) == 0 && !bVar14) {
    uStack_b0 = 0x10cc73;
    _type = xvm_new((uint64_t)dVar12);
  }
  else {
    _type = (double *)0x0;
  }
  for (dVar11 = 0.0; dVar12 != dVar11; dVar11 = (double)((long)dVar11 + 1)) {
    if ((_Var7 & 1U) == 0 && !bVar14) {
      _type[(long)dVar11] = 0.0;
    }
    x_00[(long)dVar11] = 0.0;
    x[(long)dVar11] = 0.1;
  }
  pcVar2 = local_40->opt->rstate;
  vgp = dVar12;
  local_68 = pdVar9;
  local_31 = _Var7 | bVar14;
  if (pcVar2 != (char *)0x0) {
    uStack_b0 = 0x10cccd;
    pFVar10 = fopen(pcVar2,"r");
    if (pFVar10 == (FILE *)0x0) {
      uStack_b0 = 0x10cce3;
      fatal("failed to open input state file");
    }
    uStack_b0 = 0x10ccff;
    iVar8 = __isoc99_fscanf(pFVar10,"#state#%d#%lu\n",&local_60,&local_a0);
    if (iVar8 != 2) {
      uStack_b0 = 0x10cd12;
      fatal("invalid state file");
    }
    if (local_60 != 3) {
      uStack_b0 = 0x10cd26;
      fatal("state is not for rprop model");
    }
    for (uVar13 = 0; uVar13 < local_a0; uVar13 = uVar13 + 1) {
      uStack_b0 = 0x10cd5c;
      iVar8 = __isoc99_fscanf(pFVar10,"%lu %la %la %la\n",&nftr,&f_1,&vxp,&vstp);
      if (iVar8 != 4) {
        uStack_b0 = 0x10cd6f;
        fatal("invalid state file");
      }
      if ((local_31 & 1) == 0) {
        _type[nftr] = (double)f_1;
      }
      x_00[nftr] = vstp;
      x[nftr] = vxp;
    }
    uStack_b0 = 0x10cdaf;
    fclose(pFVar10);
  }
  pdVar9 = local_68;
  uStack_b0 = 0x10cdbb;
  __ptr = (undefined8 *)xmalloc(0x28);
  dVar12 = local_48;
  *__ptr = local_40;
  __ptr[1] = _type;
  __ptr[2] = x;
  __ptr[3] = pdVar9;
  __ptr[4] = x_00;
  lVar3 = -((long)local_48 * 8 + 0xfU & 0xfffffffffffffff0);
  for (dVar11 = 0.0; pmVar6 = local_40, dVar12 != dVar11; dVar11 = (double)((long)dVar11 + 1)) {
    ((void **)((long)&pvStack_a8 + lVar3))[(long)dVar11] = __ptr;
  }
  *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10ce0e;
  local_70 = grd_new(pmVar6,pdVar9);
  *(undefined8 *)((long)&uStack_b0 + lVar3) = 1;
  uVar13 = *(ulong *)((long)&uStack_b0 + lVar3);
  do {
    pgVar4 = local_70;
    if ((uit_stop != false) || (it = (uint32_t)uVar13, local_5c <= it - 1)) break;
    *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10ce34;
    dVar11 = grd_gradient(pgVar4);
    dVar12 = local_48;
    if (uit_stop != false) break;
    local_50 = dVar11;
    *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10ce5d;
    mth_spawn(trn_rpropsub,SUB84(dVar12,0),(void **)((long)&pvStack_a8 + lVar3),0,0);
    pmVar6 = local_40;
    dVar12 = local_50;
    *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10ce6e;
    _Var7 = uit_progress(pmVar6,it,dVar12);
    uVar13 = (ulong)(it + 1);
  } while (_Var7);
  pcVar2 = local_40->opt->sstate;
  if (pcVar2 != (char *)0x0) {
    *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10ce95;
    pFVar10 = fopen(pcVar2,"w");
    dVar12 = vgp;
    if (pFVar10 == (FILE *)0x0) {
      *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10ceab;
      fatal("failed to open output state file");
    }
    *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10cec0;
    fprintf(pFVar10,"#state#3#%lu\n",dVar12);
    for (dVar12 = 0.0; vgp != dVar12; dVar12 = (double)((long)dVar12 + 1)) {
      if (_type == (double *)0x0) {
        local_50 = 0.0;
      }
      else {
        local_50 = _type[(long)dVar12];
      }
      local_40 = (mdl_t *)x[(long)dVar12];
      local_48 = x_00[(long)dVar12];
      *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10cf0c;
      fprintf(pFVar10,"%lu ",dVar12);
      pmVar6 = local_40;
      dVar5 = local_48;
      dVar11 = local_50;
      *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10cf2c;
      fprintf(pFVar10,"%la %la %la\n",dVar11,pmVar6,dVar5);
    }
    *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10cf39;
    fclose(pFVar10);
  }
  pdVar9 = _type;
  if ((local_31 & 1) == 0) {
    *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10cf48;
    xvm_free(pdVar9);
  }
  pdVar9 = local_68;
  *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10cf51;
  xvm_free(pdVar9);
  *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10cf59;
  xvm_free(x_00);
  *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10cf61;
  xvm_free(x);
  pgVar4 = local_70;
  *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10cf6a;
  grd_free(pgVar4);
  *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10cf72;
  free(__ptr);
  return;
}

Assistant:

void trn_rprop(mdl_t *mdl) {
	const uint64_t F   = mdl->nftr;
	const uint32_t K   = mdl->opt->maxiter;
	const uint32_t W   = mdl->opt->nthread;
	const bool     wbt = strcmp(mdl->opt->algo, "rprop-");
	const int      cut = mdl->opt->rprop.cutoff;
	// Allocate state memory and initialize it
	double *xp  = NULL,       *stp = xvm_new(F);
	double *g   = xvm_new(F), *gp  = xvm_new(F);
	if (wbt && !cut)
		xp = xvm_new(F);
	for (uint64_t f = 0; f < F; f++) {
		if (wbt && !cut)
			xp[f]  = 0.0;
		gp[f]  = 0.0;
		stp[f] = 0.1;
	}
	// Restore a saved state if given by the user
	if (mdl->opt->rstate != NULL) {
		const char *err = "invalid state file";
		FILE *file = fopen(mdl->opt->rstate, "r");
		if (file == NULL)
			fatal("failed to open input state file");
		int type;
		uint64_t nftr;
		if (fscanf(file, "#state#%d#%"SCNu64"\n", &type, &nftr) != 2)
			fatal(err);
		if (type != 3)
			fatal("state is not for rprop model");
		for (uint64_t i = 0; i < nftr; i++) {
			uint64_t f;
			double vxp, vstp, vgp;
			if (fscanf(file, "%"PRIu64" %la %la %la\n", &f, &vxp,
					&vstp, &vgp) != 4)
				fatal(err);
			if (wbt && !cut) xp[f] = vxp;
			gp[f] = vgp;
			stp[f] = vstp;
		}
		fclose(file);
	}
	// Prepare the rprop state used to send information to the rprop worker
	// about updating weight using the gradient.
	rprop_t *st = xmalloc(sizeof(rprop_t));
	st->mdl = mdl;
	st->xp  = xp;  st->stp = stp;
	st->g   = g;   st->gp  = gp;
	rprop_t *rprop[W];
	for (uint32_t w = 0; w < W; w++)
		rprop[w] = st;
	// Prepare the gradient state for the distributed gradient computation.
	grd_t *grd = grd_new(mdl, g);
	// And iterate the gradient computation / weight update process until
	// convergence or stop request
	for (uint32_t k = 0; !uit_stop && k < K; k++) {
		double fx = grd_gradient(grd);
		if (uit_stop)
			break;
		mth_spawn((func_t *)trn_rpropsub, W, (void **)rprop, 0, 0);
		if (uit_progress(mdl, k + 1, fx) == false)
			break;
	}
	// Save state if user requested it
	if (mdl->opt->sstate != NULL) {
		FILE *file = fopen(mdl->opt->sstate, "w");
		if (file == NULL)
			fatal("failed to open output state file");
		fprintf(file, "#state#3#%"PRIu64"\n", F);
		for (uint64_t f = 0; f < F; f++) {
			double vxp = xp != NULL ? xp[f] : 0.0;
			double vstp = stp[f], vgp = gp[f];
			fprintf(file, "%"PRIu64" ", f);
			fprintf(file, "%la %la %la\n", vxp, vstp, vgp);
		}
		fclose(file);
	}
	// Free all allocated memory
	if (wbt && !cut)
		xvm_free(xp);
	xvm_free(g);
	xvm_free(gp);
	xvm_free(stp);
	grd_free(grd);
	free(st);
}